

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

void __thiscall Assembler::processSkipSecondPass(Assembler *this,string *line)

{
  int iVar1;
  iterator iVar2;
  Assembler *this_00;
  bool bVar3;
  char local_41;
  
  this_00 = (Assembler *)&stack0xffffffffffffffc0;
  std::__cxx11::string::string((string *)&stack0xffffffffffffffc0,(string *)line);
  iVar1 = literalToDecimal(this_00,(string *)&stack0xffffffffffffffc0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  locationCounter = locationCounter + iVar1;
  while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
            ::find(&(this->codeBySection)._M_t,&currentSectionName_abi_cxx11_);
    local_41 = '\0';
    std::vector<char,_std::allocator<char>_>::emplace_back<char>
              ((vector<char,_std::allocator<char>_> *)(iVar2._M_node + 2),&local_41);
  }
  return;
}

Assistant:

void Assembler::processSkipSecondPass(string line) {
    int value = literalToDecimal(line);
    locationCounter += value;
    while (value--) {
        codeBySection.find(currentSectionName)->second.push_back(0);
    }

}